

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

vertex_descriptor __thiscall
tsbp::LeftmostActiveOnly::AddLeafNode(LeftmostActiveOnly *this,Node *node)

{
  pointer psVar1;
  pointer pRVar2;
  pointer pRVar3;
  pointer __p;
  Type TVar4;
  size_type sVar5;
  unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *this_00;
  vertex_descriptor vVar6;
  
  std::
  vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
  ::resize(&(this->tree).super_type.m_vertices,
           ((long)(this->tree).super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->tree).super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 + 1);
  psVar1 = (this->tree).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  vVar6 = ((long)(this->tree).super_type.m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) *
          -0x5555555555555555 - 1;
  pRVar2 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pRVar3 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                    (&((node->Packing)._M_t.
                       super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                       .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl)->PlacedItems);
  std::
  vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
  ::reserve((vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
             *)((this->tree).super_type.m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start + vVar6),
            (((long)pRVar2 - (long)pRVar3 >> 5) - sVar5) + 1);
  this_00 = &psVar1[vVar6].super_StoredVertex.m_property.Packing;
  *(Status *)(this_00 + -1) = (node->super_BaseNode).NodeStatus;
  TVar4 = (node->super_BaseNode).NodeType;
  *(int *)&this_00[-2]._M_t.
           super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t.
           super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
           super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl =
       (node->super_BaseNode).ItemIdToPlace;
  *(Type *)((long)&this_00[-2]._M_t.
                   super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
                   super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl + 4) = TVar4;
  __p = (node->Packing)._M_t.
        super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t.
        super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
        super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl;
  (node->Packing)._M_t.super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>
  ._M_t.super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
  super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl = (Packing2D *)0x0;
  std::__uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::reset
            ((__uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *)this_00,__p)
  ;
  return vVar6;
}

Assistant:

LeftmostActiveOnly::SearchTree::vertex_descriptor LeftmostActiveOnly::AddLeafNode(Node&& node)
{
    SearchTree::vertex_descriptor newNodeId = boost::add_vertex(this->tree);
    ////assert(node.Id == newNodeId);

    Node& newNode = this->tree[newNodeId];
    size_t remainingItemsToPlace = this->items.size() - node.PlacedItems().count();

    // TODO.Performance: this is helpful with directionalS and bidirectionalS. With bidirectionalS, edges are additionally (?) stored as members of tree.m_edges.
    this->tree.m_vertices[newNodeId].m_out_edges.reserve(remainingItemsToPlace + 1);

    newNode = std::move(node);

    return newNodeId;
}